

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

ExportedTableData *
duckdb::ExportedTableData::Deserialize
          (ExportedTableData *__return_storage_ptr__,Deserializer *deserializer)

{
  uint uVar1;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->table_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->table_name).field_2;
  (__return_storage_ptr__->table_name)._M_string_length = 0;
  (__return_storage_ptr__->table_name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->schema_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->schema_name).field_2;
  (__return_storage_ptr__->schema_name)._M_string_length = 0;
  (__return_storage_ptr__->schema_name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->database_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->database_name).field_2;
  (__return_storage_ptr__->database_name)._M_string_length = 0;
  (__return_storage_ptr__->database_name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->file_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->file_path).field_2;
  (__return_storage_ptr__->file_path)._M_string_length = 0;
  (__return_storage_ptr__->file_path).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->not_null_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->not_null_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->not_null_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,1,"table_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if (local_50 != local_40) goto LAB_005c8463;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if (local_50 != local_40) {
LAB_005c8463:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,2,"schema_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->schema_name,(string *)&local_50);
    if (local_50 != local_40) goto LAB_005c84f4;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->schema_name,(string *)&local_50);
    if (local_50 != local_40) {
LAB_005c84f4:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,3,"database_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->database_name,(string *)&local_50);
    if (local_50 != local_40) goto LAB_005c8585;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->database_name,(string *)&local_50);
    if (local_50 != local_40) {
LAB_005c8585:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,4,"file_path");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->file_path,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005c861b;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->file_path,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005c861b;
  }
  operator_delete(local_50);
LAB_005c861b:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,5,"not_null_columns",&__return_storage_ptr__->not_null_columns);
  return __return_storage_ptr__;
}

Assistant:

ExportedTableData ExportedTableData::Deserialize(Deserializer &deserializer) {
	ExportedTableData result;
	deserializer.ReadPropertyWithDefault<string>(1, "table_name", result.table_name);
	deserializer.ReadPropertyWithDefault<string>(2, "schema_name", result.schema_name);
	deserializer.ReadPropertyWithDefault<string>(3, "database_name", result.database_name);
	deserializer.ReadPropertyWithDefault<string>(4, "file_path", result.file_path);
	deserializer.ReadPropertyWithDefault<vector<string>>(5, "not_null_columns", result.not_null_columns);
	return result;
}